

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void anon_unknown.dwarf_2884ef::testAllCombinations
               (bool isAligned,bool isStereo,Compression pCompression,string *tempDir)

{
  _Alloc_hider __filename;
  _Alloc_hider pFilename;
  char *pcVar1;
  int iVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  int pWidth;
  string pRgba;
  string pRgb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar3 = "imf_optimized_aces_rgb.exr";
  iVar2 = (int)CONCAT71(in_register_00000031,isStereo);
  if (iVar2 != 0) {
    pcVar3 = "imf_optimized_aces_rgb_stereo.exr";
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = pcVar3 + 0x1a;
  if (iVar2 != 0) {
    pcVar1 = pcVar3 + 0x21;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar3,pcVar1);
  std::operator+(&local_90,tempDir,&local_70);
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = "imf_optimized_aces_rgba.exr";
  if (isStereo) {
    pcVar3 = "imf_optimized_aces_rgba_stereo.exr";
  }
  pcVar1 = pcVar3 + 0x1b;
  if (isStereo) {
    pcVar1 = pcVar3 + 0x22;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar3,pcVar1);
  std::operator+(&local_50,tempDir,&local_90);
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pFilename._M_p = local_70._M_dataplus._M_p;
  __filename._M_p = local_90._M_dataplus._M_p;
  iVar2 = isAligned + 0x47f;
  pWidth = isAligned + 0x7ff;
  remove(local_70._M_dataplus._M_p);
  remove(__filename._M_p);
  writeFile(pFilename._M_p,iVar2,pWidth,IMAGE_TYPE_RGB,isStereo,pCompression);
  writeFile(__filename._M_p,iVar2,pWidth,IMAGE_TYPE_RGBA,isStereo,pCompression);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\tRGB file to RGB framebuffer",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  readValidateFile(pFilename._M_p,iVar2,pWidth,IMAGE_TYPE_RGB,isStereo);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\tRGB file to RGB framebuffer",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  readValidateFile(pFilename._M_p,iVar2,pWidth,IMAGE_TYPE_RGB,isStereo);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\tRGB file to RGBA framebuffer",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  readValidateFile(pFilename._M_p,iVar2,pWidth,IMAGE_TYPE_RGBA,isStereo);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\tRGBA file to RGB framebuffer",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  readValidateFile(__filename._M_p,iVar2,pWidth,IMAGE_TYPE_RGB,isStereo);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t\tRGBA file to RGBA framebuffer",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  readValidateFile(__filename._M_p,iVar2,pWidth,IMAGE_TYPE_RGBA,isStereo);
  remove(pFilename._M_p);
  remove(__filename._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
testAllCombinations (
    bool               isAligned,
    bool               isStereo,
    Compression        pCompression,
    const std::string& tempDir)
{
    std::string pRgb  = isStereo ? RGB_STEREO_FILENAME : RGB_FILENAME;
    pRgb              = tempDir + pRgb;
    std::string pRgba = isStereo ? RGBA_STEREO_FILENAME : RGBA_FILENAME;
    pRgba             = tempDir + pRgba;

    const char* pRgbFilename  = pRgb.c_str ();
    const char* pRgbaFilename = pRgba.c_str ();

    const int pHeight = isAligned ? IMAGE_2K_HEIGHT : IMAGE_2K_HEIGHT - 1;
    const int pWidth  = isAligned ? IMAGE_2K_WIDTH : IMAGE_2K_WIDTH - 1;

    remove (pRgbFilename);
    remove (pRgbaFilename);

    writeFile (
        pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo, pCompression);
    writeFile (
        pRgbaFilename,
        pHeight,
        pWidth,
        IMAGE_TYPE_RGBA,
        isStereo,
        pCompression);

    cout << "\t\tRGB file to RGB framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGB file to RGB framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGB file to RGBA framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGBA, isStereo);

    cout << "\t\tRGBA file to RGB framebuffer" << endl;
    readValidateFile (pRgbaFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGBA file to RGBA framebuffer" << endl;
    readValidateFile (
        pRgbaFilename, pHeight, pWidth, IMAGE_TYPE_RGBA, isStereo);

    remove (pRgbFilename);
    remove (pRgbaFilename);
}